

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O2

int p256_encap_with_seed
              (EVP_HPKE_KEM *kem,uint8_t *out_shared_secret,size_t *out_shared_secret_len,
              uint8_t *out_enc,size_t *out_enc_len,size_t max_enc,uint8_t *peer_public_key,
              size_t peer_public_key_len,uint8_t *seed,size_t seed_len)

{
  uint16_t kem_id;
  int iVar1;
  EVP_MD *hkdf_md;
  int line;
  size_t in_stack_ffffffffffffff00;
  uint8_t private_key [32];
  uint8_t dh [32];
  uint8_t kem_context [130];
  
  if (max_enc < 0x41) {
    iVar1 = 0x89;
    line = 0x1c7;
  }
  else {
    if (seed_len == 0x20) {
      iVar1 = p256_private_key_from_seed(private_key,seed);
      if (iVar1 != 0) {
        p256_public_from_private(out_enc,private_key);
        if ((peer_public_key_len != 0x41) ||
           (iVar1 = p256(dh,private_key,peer_public_key), iVar1 == 0)) {
          iVar1 = 0x86;
          line = 0x1d7;
          goto LAB_00181142;
        }
        memcpy(kem_context,out_enc,0x41);
        memcpy(kem_context + 0x41,peer_public_key,0x41);
        kem_id = kem->id;
        hkdf_md = EVP_sha256();
        iVar1 = dhkem_extract_and_expand
                          (kem_id,(EVP_MD *)hkdf_md,out_shared_secret,(size_t)dh,(uint8_t *)0x20,
                           (size_t)kem_context,(uint8_t *)0x82,in_stack_ffffffffffffff00);
        if (iVar1 != 0) {
          *out_enc_len = 0x41;
          *out_shared_secret_len = 0x20;
          return 1;
        }
      }
      return 0;
    }
    iVar1 = 0x66;
    line = 0x1cb;
  }
LAB_00181142:
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,line);
  return 0;
}

Assistant:

static int p256_encap_with_seed(const EVP_HPKE_KEM *kem,
                                uint8_t *out_shared_secret,
                                size_t *out_shared_secret_len, uint8_t *out_enc,
                                size_t *out_enc_len, size_t max_enc,
                                const uint8_t *peer_public_key,
                                size_t peer_public_key_len, const uint8_t *seed,
                                size_t seed_len) {
  if (max_enc < P256_PUBLIC_VALUE_LEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_BUFFER_SIZE);
    return 0;
  }
  if (seed_len != P256_SEED_LEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }
  uint8_t private_key[P256_PRIVATE_KEY_LEN];
  if (!p256_private_key_from_seed(private_key, seed)) {
    return 0;
  }
  p256_public_from_private(out_enc, private_key);

  uint8_t dh[P256_SHARED_KEY_LEN];
  if (peer_public_key_len != P256_PUBLIC_VALUE_LEN ||
      !p256(dh, private_key, peer_public_key)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PEER_KEY);
    return 0;
  }

  uint8_t kem_context[2 * P256_PUBLIC_VALUE_LEN];
  OPENSSL_memcpy(kem_context, out_enc, P256_PUBLIC_VALUE_LEN);
  OPENSSL_memcpy(kem_context + P256_PUBLIC_VALUE_LEN, peer_public_key,
                 P256_PUBLIC_VALUE_LEN);
  if (!dhkem_extract_and_expand(kem->id, EVP_sha256(), out_shared_secret,
                                SHA256_DIGEST_LENGTH, dh, sizeof(dh),
                                kem_context, sizeof(kem_context))) {
    return 0;
  }

  *out_enc_len = P256_PUBLIC_VALUE_LEN;
  *out_shared_secret_len = SHA256_DIGEST_LENGTH;
  return 1;
}